

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O3

void __thiscall
yactfr::internal::PseudoDlArrayType::PseudoDlArrayType
          (PseudoDlArrayType *this,uint minAlign,PseudoDataLoc *pseudoLenLoc,Up *pseudoElemType,
          Up *attrs,TextLocation loc)

{
  PseudoDt *pPVar1;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> _Var2;
  pointer poVar3;
  pointer poVar4;
  pointer poVar5;
  Kind KVar6;
  bool bVar7;
  undefined3 uVar8;
  __uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_80;
  __uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_78;
  undefined8 local_70;
  Scope local_68;
  vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  Index local_48;
  Index IStack_40;
  Index local_38;
  
  pPVar1 = (pseudoElemType->_M_t).
           super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
           ._M_t.
           super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
           .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl;
  (pseudoElemType->_M_t).
  super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
  ._M_t.
  super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
  .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl = (PseudoDt *)0x0;
  _Var2._M_head_impl =
       (attrs->_M_t).
       super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
       super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl;
  (attrs->_M_t).
  super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl = (MapItem *)0x0;
  (this->super_PseudoArrayType).super_PseudoDt._vptr_PseudoDt =
       (_func_int **)&PTR__PseudoDt_002fd640;
  (this->super_PseudoArrayType).super_PseudoDt._loc._offset = loc._offset;
  (this->super_PseudoArrayType).super_PseudoDt._loc._lineNumber = loc._lineNumber;
  (this->super_PseudoArrayType).super_PseudoDt._loc._colNumber = loc._colNumber;
  (this->super_PseudoArrayType).super_PseudoDt._posInScope.super_type.m_initialized = false;
  local_80._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
       (tuple<const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
       (_Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)0x0;
  (this->super_PseudoArrayType).super_WithAttrsMixin._attrs._M_t.
  super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl = _Var2._M_head_impl;
  local_78._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
       (tuple<const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
       (_Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)0x0;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_78);
  (this->super_PseudoArrayType).super_PseudoDt._vptr_PseudoDt =
       (_func_int **)&PTR__PseudoArrayType_002fdd20;
  (this->super_PseudoArrayType)._minAlign = minAlign;
  (this->super_PseudoArrayType)._pseudoElemType._M_t.
  super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
  ._M_t.
  super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
  .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl = pPVar1;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_80);
  local_68 = (pseudoLenLoc->_scope).super_type.m_storage;
  local_70._0_4_ = pseudoLenLoc->_kind;
  local_70._4_1_ = (pseudoLenLoc->_scope).super_type.m_initialized;
  local_70._5_3_ = *(undefined3 *)&(pseudoLenLoc->_scope).super_type.field_0x1;
  poVar3 = (pseudoLenLoc->_pathElems).
           super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  poVar4 = (pseudoLenLoc->_pathElems).
           super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  poVar5 = (pseudoLenLoc->_pathElems).
           super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (pseudoLenLoc->_pathElems).
  super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pseudoLenLoc->_pathElems).
  super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pseudoLenLoc->_pathElems).
  super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = (pseudoLenLoc->_loc)._colNumber;
  local_48 = (pseudoLenLoc->_loc)._offset;
  IStack_40 = (pseudoLenLoc->_loc)._lineNumber;
  KVar6 = pseudoLenLoc->_kind;
  bVar7 = (pseudoLenLoc->_scope).super_type.m_initialized;
  uVar8 = *(undefined3 *)&(pseudoLenLoc->_scope).super_type.field_0x1;
  (this->super_PseudoDlDtMixin)._pseudoLenLoc._scope.super_type.m_storage =
       (pseudoLenLoc->_scope).super_type.m_storage;
  (this->super_PseudoDlDtMixin)._pseudoLenLoc._kind = KVar6;
  (this->super_PseudoDlDtMixin)._pseudoLenLoc._scope.super_type.m_initialized = bVar7;
  *(undefined3 *)&(this->super_PseudoDlDtMixin)._pseudoLenLoc._scope.super_type.field_0x1 = uVar8;
  (this->super_PseudoDlDtMixin)._pseudoLenLoc._pathElems.
  super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = poVar4;
  (this->super_PseudoDlDtMixin)._pseudoLenLoc._pathElems.
  super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = poVar5;
  (this->super_PseudoDlDtMixin)._pseudoLenLoc._pathElems.
  super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = poVar3;
  local_60.
  super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.
  super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.
  super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PseudoDlDtMixin)._pseudoLenLoc._loc._colNumber = local_38;
  (this->super_PseudoDlDtMixin)._pseudoLenLoc._loc._offset = local_48;
  (this->super_PseudoDlDtMixin)._pseudoLenLoc._loc._lineNumber = IStack_40;
  (this->super_PseudoDlDtMixin)._lenLoc.super_type.m_initialized = false;
  std::
  vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_60);
  (this->super_PseudoArrayType).super_PseudoDt._vptr_PseudoDt =
       (_func_int **)&PTR__PseudoDlArrayType_002fd7c0;
  return;
}

Assistant:

PseudoDlArrayType::PseudoDlArrayType(const unsigned int minAlign, PseudoDataLoc pseudoLenLoc, PseudoDt::Up pseudoElemType,
                                     MapItem::Up attrs, TextLocation loc) :
    PseudoArrayType {minAlign, std::move(pseudoElemType), std::move(attrs), std::move(loc)},
    PseudoDlDtMixin {std::move(pseudoLenLoc)}
{
}